

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,duckdb::dtime_tz_t,duckdb::dtime_tz_t,duckdb::BinaryStandardOperatorWrapper,duckdb::AddTimeOperator,bool,false,true>
               (interval_t *ldata,dtime_tz_t *rdata,dtime_tz_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  Interval *pIVar3;
  dtime_tz_t left;
  dtime_tz_t left_00;
  dtime_tz_t dVar4;
  ulong uVar5;
  idx_t iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int64_t *piVar10;
  ulong uVar11;
  interval_t right;
  interval_t right_00;
  interval_t right_01;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  ulong local_50;
  dtime_tz_t *local_48;
  ValidityMask *local_40;
  dtime_tz_t *local_38;
  
  local_40 = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      pIVar3 = (Interval *)rdata->bits;
      piVar10 = &ldata->micros;
      iVar6 = 0;
      do {
        dVar4.bits._0_4_ = ((interval_t *)(piVar10 + -1))->months;
        dVar4.bits._4_4_ = ((interval_t *)(piVar10 + -1))->days;
        local_54 = 0;
        right_01.micros = (int64_t)&local_54;
        right_01._0_8_ = *piVar10;
        dVar4 = Interval::Add(pIVar3,dVar4,right_01,(date_t *)mask);
        result_data[iVar6].bits = dVar4.bits;
        iVar6 = iVar6 + 1;
        piVar10 = piVar10 + 2;
      } while (count != iVar6);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_50 = count + 0x3f >> 6;
    uVar5 = 0;
    uVar9 = 0;
    local_48 = result_data;
    do {
      puVar1 = (local_40->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar7 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar7 = count;
        }
LAB_00969fe0:
        uVar8 = uVar9;
        if (uVar9 < uVar7) {
          pIVar3 = (Interval *)rdata->bits;
          piVar10 = &ldata[uVar9].micros;
          do {
            left.bits._0_4_ = ((interval_t *)(piVar10 + -1))->months;
            left.bits._4_4_ = ((interval_t *)(piVar10 + -1))->days;
            local_5c = 0;
            right.micros = (int64_t)&local_5c;
            right._0_8_ = *piVar10;
            dVar4 = Interval::Add(pIVar3,left,right,(date_t *)mask);
            result_data[uVar9].bits = dVar4.bits;
            uVar9 = uVar9 + 1;
            piVar10 = piVar10 + 2;
            uVar8 = uVar7;
          } while (uVar7 != uVar9);
        }
      }
      else {
        uVar2 = puVar1[uVar5];
        uVar7 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar7 = count;
        }
        uVar8 = uVar7;
        if (uVar2 != 0) {
          if (uVar2 == 0xffffffffffffffff) goto LAB_00969fe0;
          uVar8 = uVar9;
          if (uVar9 < uVar7) {
            local_38 = result_data + uVar9;
            piVar10 = &ldata[uVar9].micros;
            uVar11 = 0;
            do {
              if ((uVar2 >> (uVar11 & 0x3f) & 1) != 0) {
                left_00.bits._0_4_ = ((interval_t *)(piVar10 + -1))->months;
                left_00.bits._4_4_ = ((interval_t *)(piVar10 + -1))->days;
                local_58 = 0;
                right_00.micros = (int64_t)&local_58;
                right_00._0_8_ = *piVar10;
                dVar4 = Interval::Add((Interval *)rdata->bits,left_00,right_00,(date_t *)mask);
                local_38[uVar11].bits = dVar4.bits;
              }
              uVar11 = uVar11 + 1;
              piVar10 = piVar10 + 2;
              uVar8 = uVar7;
              result_data = local_48;
            } while (uVar7 - uVar9 != uVar11);
          }
        }
      }
      uVar5 = uVar5 + 1;
      uVar9 = uVar8;
    } while (uVar5 != local_50);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}